

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O1

bool jsoncons::
     order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
     ::compare1(index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *item1,index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *item2)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((string *)item1);
  if (iVar2 < 0) {
    bVar1 = true;
  }
  else if (iVar2 == 0) {
    bVar1 = item1->index < item2->index;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool compare1(const index_key_value<Json>& item1, const index_key_value<Json>& item2)
        {
            int comp = item1.name.compare(item2.name); 
            if (comp < 0) return true;
            if (comp == 0) return item1.index < item2.index;

            return false;
        }